

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> __thiscall
jbcoin::setDebugLogSink
          (jbcoin *this,
          unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> *sink)

{
  DebugSink *sink_00;
  unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> local_20;
  unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> *local_18;
  unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> *sink_local;
  
  local_18 = sink;
  sink_local = (unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> *)this;
  sink_00 = debugSink();
  std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>::unique_ptr
            (&local_20,sink);
  DebugSink::set((DebugSink *)this,
                 (unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> *)
                 sink_00);
  std::unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>,_true,_true>
          )(__uniq_ptr_data<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<beast::Journal::Sink>
setDebugLogSink(
    std::unique_ptr<beast::Journal::Sink> sink)
{
    return debugSink().set(std::move(sink));
}